

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

void ts_subtree_set_children
               (MutableSubtree self,Subtree *children,uint32_t child_count,TSLanguage *language)

{
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Subtree *__ptr;
  SubtreeHeapData *pSVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  TSStateId TVar8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  ulong uVar13;
  anon_struct_4_2_f6059b32_for_first_leaf *paVar14;
  TSStateId *pTVar15;
  TSSymbol *pTVar16;
  byte bVar18;
  uint32_t uVar17;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  SubtreeHeapData *pSVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint uVar28;
  uint32_t uVar29;
  ulong uVar30;
  uint32_t uVar31;
  Length result;
  uint local_9c;
  uint local_98;
  int local_84;
  undefined4 uStack_6c;
  int iStack_5c;
  
  if (((ulong)self.ptr & 1) != 0) {
    __assert_fail("!self.data.is_inline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                  ,0x15b,
                  "void ts_subtree_set_children(MutableSubtree, Subtree *, uint32_t, const TSLanguage *)"
                 );
  }
  if (((self.ptr)->child_count != 0) &&
     (__ptr = ((self.ptr)->field_17).field_0.children, __ptr != children)) {
    free(__ptr);
  }
  (self.ptr)->child_count = child_count;
  ((self.ptr)->field_17).field_0.children = children;
  pTVar16 = (TSSymbol *)0x0;
  (self.ptr)->error_cost = 0;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 8) = 0;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 0x10) = 1;
  local_9c = *(ushort *)&(self.ptr)->field_0x2c & 0xffffffbf;
  *(short *)&(self.ptr)->field_0x2c = (short)local_9c;
  ((self.ptr)->field_17).field_0.dynamic_precedence = 0;
  TVar8 = TS_TREE_STATE_NONE;
  uVar24 = (ulong)((self.ptr)->field_17).field_0.alias_sequence_id;
  if (uVar24 != 0) {
    pTVar16 = language->alias_sequences + language->max_alias_sequence_length * uVar24;
  }
  if (child_count == 0) {
    uVar12 = ((self.ptr)->size).bytes;
    iVar9 = ((self.ptr)->padding).bytes + uVar12;
    uVar17 = 0;
    local_98 = 0;
  }
  else {
    uVar27 = 1;
    uVar11 = 0;
    uVar29 = 0;
    local_84 = 0;
    uVar17 = 0;
    uVar30 = 0;
    uVar24 = 0;
    local_98 = 0;
    do {
      pSVar4 = children[uVar30].ptr;
      uVar19 = (uint)((ulong)pSVar4 >> 0x20);
      uVar28 = (uint)((ulong)pSVar4 >> 0x10);
      if (uVar30 == 0) {
        if (((ulong)pSVar4 & 1) != 0) {
          uVar28 = uVar28 & 0xff;
          uVar21 = (ulong)pSVar4 >> 8 & 0xf00000000 | (ulong)uVar28;
          ((Length *)((long)self + 4))->bytes = (int)uVar21;
          (((Length *)((long)self + 4))->extent).row = (int)(uVar21 >> 0x20);
          ((self.ptr)->padding).extent.column = uVar19 & 0xff;
          uVar21 = (ulong)pSVar4 >> 0x18 & 0xff;
          ((Length *)((long)self + 0x10))->bytes = (int)uVar21;
          (((Length *)((long)self + 0x10))->extent).row = (int)(uVar21 >> 0x20);
          ((self.ptr)->size).extent.column = (uint32_t)uVar21;
          iVar9 = uVar28 + (uint32_t)uVar21;
          goto LAB_00133021;
        }
        uVar3 = (pSVar4->padding).bytes;
        uVar6 = (pSVar4->padding).extent.row;
        uVar12 = (pSVar4->padding).extent.column;
        ((Length *)((long)self + 4))->bytes = uVar3;
        (((Length *)((long)self + 4))->extent).row = uVar6;
        ((self.ptr)->padding).extent.column = uVar12;
        uVar21._0_4_ = (pSVar4->size).bytes;
        uVar21._4_4_ = (pSVar4->size).extent.row;
        uVar12 = (pSVar4->size).extent.column;
        ((Length *)((long)self + 0x10))->bytes = (undefined4)uVar21;
        (((Length *)((long)self + 0x10))->extent).row = uVar21._4_4_;
        ((self.ptr)->size).extent.column = uVar12;
        iVar9 = uVar3 + (undefined4)uVar21;
LAB_0013307a:
        uVar12 = (uint32_t)uVar21;
        uVar28 = pSVar4->lookahead_bytes + iVar9;
        if (local_98 < uVar28) {
          local_98 = uVar28;
        }
        if (pSVar4->symbol != 0xfffe) {
          uVar26 = 0x262;
          if ((pSVar4->field_0x2c & 0x80) == 0) {
            uVar26 = pSVar4->error_cost;
          }
          uVar17 = uVar17 + uVar26;
          (self.ptr)->error_cost = uVar17;
        }
        if (pSVar4->child_count == 0) {
          iVar10 = 0;
        }
        else {
          iVar10 = (pSVar4->field_17).field_0.dynamic_precedence;
        }
        local_84 = local_84 + iVar10;
        ((self.ptr)->field_17).field_0.dynamic_precedence = local_84;
        if (pSVar4->child_count == 0) {
          uVar31 = 1;
        }
        else {
          uVar31 = (pSVar4->field_17).field_0.node_count;
        }
        bVar7 = false;
      }
      else {
        if (((ulong)pSVar4 & 1) == 0) {
          uVar13._0_4_ = (pSVar4->padding).bytes;
          uVar13._4_4_ = (pSVar4->padding).extent.row;
          uVar20 = (pSVar4->padding).extent.column;
          uVar23._0_4_ = (pSVar4->size).bytes;
          uVar23._4_4_ = (pSVar4->size).extent.row;
          uVar12 = (pSVar4->size).extent.column;
          iVar9 = uVar23._4_4_;
        }
        else {
          uVar20 = uVar19 & 0xff;
          uVar13 = (ulong)pSVar4 >> 8 & 0xf00000000 | (ulong)(uVar28 & 0xff);
          uVar23 = (ulong)pSVar4 >> 0x18 & 0xff;
          uVar12 = (uint32_t)uVar23;
          iVar9 = 0;
        }
        uStack_6c = (undefined4)(uVar13 >> 0x20);
        uVar22 = CONCAT44(uVar20,uStack_6c) + CONCAT44(uVar12,iVar9);
        uVar21 = uVar22 & 0xffffffff | (ulong)uVar12 << 0x20;
        if (iVar9 == 0) {
          uVar21 = uVar22;
        }
        iStack_5c = (int)uVar21;
        uVar2 = ((Length *)((long)self + 0x10))->bytes;
        uVar5 = (((Length *)((long)self + 0x10))->extent).row;
        iVar9 = (int)uVar13 + (int)uVar23 + uVar2;
        uVar23 = CONCAT44(((self.ptr)->size).extent.column,uVar5) + uVar21;
        uVar13 = uVar23 & 0xffffffff | uVar21 & 0xffffffff00000000;
        if (iStack_5c == 0) {
          uVar13 = uVar23;
        }
        iStack_5c = (int)uVar13;
        uVar21 = CONCAT44(iStack_5c,iVar9);
        ((Length *)((long)self + 0x10))->bytes = iVar9;
        (((Length *)((long)self + 0x10))->extent).row = iStack_5c;
        ((self.ptr)->size).extent.column = (uint32_t)(uVar13 >> 0x20);
        iVar9 = ((self.ptr)->padding).bytes + iVar9;
        if (((ulong)pSVar4 & 1) == 0) goto LAB_0013307a;
LAB_00133021:
        uVar12 = (uint32_t)uVar21;
        uVar28 = (uVar19 >> 0xc & 0xf) + iVar9;
        if (uVar28 <= local_98) {
          uVar28 = local_98;
        }
        uVar26 = uVar17 + 0x262;
        if (((ulong)pSVar4 & 0x20) == 0) {
          uVar26 = uVar17;
        }
        (self.ptr)->error_cost = uVar26;
        uVar31 = 1;
        bVar7 = true;
        local_98 = uVar28;
        uVar17 = uVar26;
      }
      uVar27 = uVar27 + uVar31;
      ((self.ptr)->field_17).field_0.node_count = uVar27;
      if ((pTVar16 == (TSSymbol *)0x0) || (pTVar16[uVar24] == 0)) {
LAB_0013310a:
        if (bVar7) {
          if (((ulong)pSVar4 & 2) != 0) {
            ((self.ptr)->field_17).field_0.visible_child_count = uVar29 + 1;
            if (((ulong)pSVar4 & 4) == 0) goto joined_r0x001331e4;
            uVar11 = uVar11 + 1;
            ((self.ptr)->field_17).field_0.named_child_count = uVar11;
            uVar29 = uVar29 + 1;
          }
          goto LAB_001331c2;
        }
        if ((pSVar4->field_0x2c & 1) == 0) {
          if (pSVar4->child_count != 0) {
            uVar29 = uVar29 + (pSVar4->field_17).field_0.visible_child_count;
            ((self.ptr)->field_17).field_0.visible_child_count = uVar29;
            uVar26 = (pSVar4->field_17).field_0.named_child_count;
LAB_00133173:
            uVar11 = uVar11 + uVar26;
            ((self.ptr)->field_17).field_0.named_child_count = uVar11;
          }
        }
        else {
          uVar29 = uVar29 + 1;
          ((self.ptr)->field_17).field_0.visible_child_count = uVar29;
          uVar26 = 1;
          if ((pSVar4->field_0x2c & 2) != 0) goto LAB_00133173;
        }
LAB_001331e6:
        if ((pSVar4->field_0x2c & 0x40) != 0) {
          local_9c = local_9c | 0x40;
          *(short *)&(self.ptr)->field_0x2c = (short)local_9c;
        }
        if (pSVar4->symbol == 0xffff) {
          local_9c = local_9c | 0x18;
          *(short *)&(self.ptr)->field_0x2c = (short)local_9c;
          (self.ptr)->parse_state = TVar8;
        }
        uVar28 = *(uint *)&pSVar4->field_0x2c >> 2;
      }
      else {
        if (bVar7) {
          uVar28 = (uint)((ulong)pSVar4 >> 3) & 0x1fffffff;
        }
        else {
          uVar28 = *(uint *)&pSVar4->field_0x2c >> 2;
        }
        if ((uVar28 & 1) != 0) goto LAB_0013310a;
        ((self.ptr)->field_17).field_0.visible_child_count = uVar29 + 1;
        uVar1 = pTVar16[uVar24];
        if ((uVar1 != 0xfffe) &&
           ((uVar1 == 0xffff || (((byte)language->symbol_metadata[uVar1] & 2) != 0)))) {
          uVar11 = uVar11 + 1;
          ((self.ptr)->field_17).field_0.named_child_count = uVar11;
        }
joined_r0x001331e4:
        uVar29 = uVar29 + 1;
        if (!bVar7) goto LAB_001331e6;
LAB_001331c2:
        uVar28 = (uint)pSVar4 >> 3;
      }
      uVar24 = (ulong)((int)uVar24 + (uint)((uVar28 & 1) == 0));
      uVar30 = uVar30 + 1;
    } while (child_count != uVar30);
  }
  (self.ptr)->lookahead_bytes = local_98 - iVar9;
  uVar1 = (self.ptr)->symbol;
  if (0xfffd < uVar1) {
    uVar12 = uVar17 + uVar12 + ((self.ptr)->size).extent.row * 0x1e + 500;
    (self.ptr)->error_cost = uVar12;
    if (child_count == 0) {
      return;
    }
    uVar24 = 0;
    do {
      pSVar4 = children[uVar24].ptr;
      if (((ulong)pSVar4 & 1) == 0) {
        if (((*(ushort *)&pSVar4->field_0x2c & 4) == 0) &&
           (pSVar4->symbol != 0xffff || pSVar4->child_count != 0)) {
          iVar9 = 100;
          if ((*(ushort *)&pSVar4->field_0x2c & 1) == 0) {
            if (pSVar4->child_count == 0) goto LAB_001332d5;
            iVar9 = (pSVar4->field_17).field_0.visible_child_count * 100;
          }
LAB_001332a9:
          uVar12 = uVar12 + iVar9;
          (self.ptr)->error_cost = uVar12;
        }
      }
      else {
        iVar9 = 100;
        if (((uint)pSVar4 & 10) == 2) goto LAB_001332a9;
      }
LAB_001332d5:
      uVar24 = uVar24 + 1;
    } while (child_count != uVar24);
  }
  if (child_count == 0) {
    return;
  }
  pSVar4 = children->ptr;
  pSVar25 = children[child_count - 1].ptr;
  bVar18 = (byte)((ulong)pSVar4 >> 8);
  if (((ulong)pSVar4 & 1) == 0) {
    paVar14 = &(pSVar4->field_17).field_0.first_leaf;
    if (pSVar4->child_count == 0) {
      paVar14 = (anon_struct_4_2_f6059b32_for_first_leaf *)&pSVar4->symbol;
    }
    ((self.ptr)->field_17).field_0.first_leaf.symbol = paVar14->symbol;
    pTVar15 = &(pSVar4->field_17).field_0.first_leaf.parse_state;
    if (pSVar4->child_count == 0) {
      pTVar15 = &pSVar4->parse_state;
    }
    ((self.ptr)->field_17).field_0.first_leaf.parse_state = *pTVar15;
    if ((pSVar4->field_0x2c & 8) != 0) {
      local_9c = local_9c | 8;
      *(short *)&(self.ptr)->field_0x2c = (short)local_9c;
    }
  }
  else {
    *(ushort *)((long)&(self.ptr)->field_17 + 0x1e) = (ushort)bVar18;
    ((self.ptr)->field_17).field_0.first_leaf.parse_state = (TSStateId)((ulong)pSVar4 >> 0x30);
  }
  if ((((ulong)pSVar25 & 1) == 0) && ((pSVar25->field_0x2c & 0x10) != 0)) {
    local_9c = local_9c | 0x10;
    *(short *)&(self.ptr)->field_0x2c = (short)local_9c;
  }
  if (child_count == 1) {
    return;
  }
  if (((local_9c >> 1 | local_9c) & 1) != 0) {
    return;
  }
  if (((ulong)pSVar4 & 1) == 0) {
    if (pSVar4->symbol != uVar1) {
      return;
    }
    if (pSVar4->child_count == 0) goto LAB_001333b8;
    uVar28 = (pSVar4->field_17).field_0.repeat_depth;
  }
  else {
    if (bVar18 != uVar1) {
      return;
    }
LAB_001333b8:
    uVar28 = 0;
  }
  if ((((ulong)pSVar25 & 1) == 0) && (pSVar25->child_count != 0)) {
    if ((pSVar25->field_17).field_0.repeat_depth < uVar28) {
      uVar12 = 1;
      if (((ulong)pSVar4 & 1) != 0) goto LAB_001333f6;
      goto LAB_001333e8;
    }
  }
  else {
    uVar12 = 1;
    if (uVar28 == 0 || ((ulong)pSVar4 & 1) != 0) goto LAB_001333f6;
LAB_001333e8:
    uVar12 = 1;
    pSVar25 = pSVar4;
    if (pSVar4->child_count == 0) goto LAB_001333f6;
  }
  uVar12 = (pSVar25->field_17).field_0.repeat_depth + 1;
LAB_001333f6:
  ((self.ptr)->field_17).field_0.repeat_depth = uVar12;
  return;
}

Assistant:

void ts_subtree_set_children(
  MutableSubtree self, Subtree *children, uint32_t child_count, const TSLanguage *language
) {
  assert(!self.data.is_inline);

  if (self.ptr->child_count > 0 && children != self.ptr->children) {
    ts_free(self.ptr->children);
  }

  self.ptr->child_count = child_count;
  self.ptr->children = children;
  self.ptr->named_child_count = 0;
  self.ptr->visible_child_count = 0;
  self.ptr->error_cost = 0;
  self.ptr->repeat_depth = 0;
  self.ptr->node_count = 1;
  self.ptr->has_external_tokens = false;
  self.ptr->dynamic_precedence = 0;

  uint32_t non_extra_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
  uint32_t lookahead_end_byte = 0;

  for (uint32_t i = 0; i < self.ptr->child_count; i++) {
    Subtree child = self.ptr->children[i];

    if (i == 0) {
      self.ptr->padding = ts_subtree_padding(child);
      self.ptr->size = ts_subtree_size(child);
    } else {
      self.ptr->size = length_add(self.ptr->size, ts_subtree_total_size(child));
    }

    uint32_t child_lookahead_end_byte =
      self.ptr->padding.bytes +
      self.ptr->size.bytes +
      ts_subtree_lookahead_bytes(child);
    if (child_lookahead_end_byte > lookahead_end_byte) lookahead_end_byte = child_lookahead_end_byte;

    if (ts_subtree_symbol(child) != ts_builtin_sym_error_repeat) {
      self.ptr->error_cost += ts_subtree_error_cost(child);
    }

    self.ptr->dynamic_precedence += ts_subtree_dynamic_precedence(child);
    self.ptr->node_count += ts_subtree_node_count(child);

    if (alias_sequence && alias_sequence[non_extra_index] != 0 && !ts_subtree_extra(child)) {
      self.ptr->visible_child_count++;
      if (ts_language_symbol_metadata(language, alias_sequence[non_extra_index]).named) {
        self.ptr->named_child_count++;
      }
    } else if (ts_subtree_visible(child)) {
      self.ptr->visible_child_count++;
      if (ts_subtree_named(child)) self.ptr->named_child_count++;
    } else if (ts_subtree_child_count(child) > 0) {
      self.ptr->visible_child_count += child.ptr->visible_child_count;
      self.ptr->named_child_count += child.ptr->named_child_count;
    }

    if (ts_subtree_has_external_tokens(child)) self.ptr->has_external_tokens = true;

    if (ts_subtree_is_error(child)) {
      self.ptr->fragile_left = self.ptr->fragile_right = true;
      self.ptr->parse_state = TS_TREE_STATE_NONE;
    }

    if (!ts_subtree_extra(child)) non_extra_index++;
  }

  self.ptr->lookahead_bytes = lookahead_end_byte - self.ptr->size.bytes - self.ptr->padding.bytes;

  if (self.ptr->symbol == ts_builtin_sym_error || self.ptr->symbol == ts_builtin_sym_error_repeat) {
    self.ptr->error_cost +=
      ERROR_COST_PER_RECOVERY +
      ERROR_COST_PER_SKIPPED_CHAR * self.ptr->size.bytes +
      ERROR_COST_PER_SKIPPED_LINE * self.ptr->size.extent.row;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      uint32_t grandchild_count = ts_subtree_child_count(child);
      if (ts_subtree_extra(child)) continue;
      if (ts_subtree_is_error(child) && grandchild_count == 0) continue;
      if (ts_subtree_visible(child)) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE;
      } else if (grandchild_count > 0) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE * child.ptr->visible_child_count;
      }
    }
  }

  if (self.ptr->child_count > 0) {
    Subtree first_child = self.ptr->children[0];
    Subtree last_child = self.ptr->children[self.ptr->child_count - 1];

    self.ptr->first_leaf.symbol = ts_subtree_leaf_symbol(first_child);
    self.ptr->first_leaf.parse_state = ts_subtree_leaf_parse_state(first_child);

    if (ts_subtree_fragile_left(first_child)) self.ptr->fragile_left = true;
    if (ts_subtree_fragile_right(last_child)) self.ptr->fragile_right = true;

    if (
      self.ptr->child_count >= 2 &&
      !self.ptr->visible &&
      !self.ptr->named &&
      ts_subtree_symbol(first_child) == self.ptr->symbol
    ) {
      if (ts_subtree_repeat_depth(first_child) > ts_subtree_repeat_depth(last_child)) {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(first_child) + 1;
      } else {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(last_child) + 1;
      }
    }
  }
}